

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

void __thiscall
boost::shared_ptr<boost::runtime::basic_param>::
shared_ptr<boost::runtime::enum_parameter<boost::unit_test::log_level,(boost::runtime::args_amount)0>>
          (shared_ptr<boost::runtime::basic_param> *this,
          enum_parameter<boost::unit_test::log_level,_(boost::runtime::args_amount)0> *p)

{
  sp_counted_base *in_RSI;
  shared_count *in_RDI;
  enum_parameter<boost::unit_test::log_level,_(boost::runtime::args_amount)0> *p_00;
  shared_ptr<boost::runtime::basic_param> *in_stack_ffffffffffffffe0;
  
  in_RDI->pi_ = in_RSI;
  p_00 = (enum_parameter<boost::unit_test::log_level,_(boost::runtime::args_amount)0> *)(in_RDI + 1)
  ;
  detail::shared_count::shared_count((shared_count *)p_00);
  detail::
  sp_pointer_construct<boost::runtime::basic_param,boost::runtime::enum_parameter<boost::unit_test::log_level,(boost::runtime::args_amount)0>>
            (in_stack_ffffffffffffffe0,p_00,in_RDI);
  return;
}

Assistant:

explicit shared_ptr( Y * p ): px( p ), pn() // Y must be complete
    {
        boost::detail::sp_pointer_construct( this, p, pn );
    }